

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128WithReloc
          (BinaryWriter *this,Index index,char *desc,RelocType reloc_type)

{
  RelocType reloc_type_local;
  char *desc_local;
  Index index_local;
  BinaryWriter *this_local;
  
  if ((this->options_->relocatable & 1U) == 0) {
    WriteU32Leb128(this->stream_,index,desc);
  }
  else {
    AddReloc(this,reloc_type,index);
    WriteFixedU32Leb128(this->stream_,index,desc);
  }
  return;
}

Assistant:

void BinaryWriter::WriteU32Leb128WithReloc(Index index,
                                           const char* desc,
                                           RelocType reloc_type) {
  if (options_.relocatable) {
    AddReloc(reloc_type, index);
    WriteFixedU32Leb128(stream_, index, desc);
  } else {
    WriteU32Leb128(stream_, index, desc);
  }
}